

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

Orientations __thiscall QGridLayout::expandingDirections(QGridLayout *this)

{
  QGridLayoutPrivate *this_00;
  int hSpacing;
  int vSpacing;
  Orientations OVar1;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  hSpacing = horizontalSpacing(this);
  vSpacing = verticalSpacing(this);
  OVar1 = QGridLayoutPrivate::expandingDirections(this_00,hSpacing,vSpacing);
  return (Orientations)
         OVar1.super_QFlagsStorageHelper<Qt::Orientation,_4>.super_QFlagsStorage<Qt::Orientation>.i;
}

Assistant:

Qt::Orientations QGridLayout::expandingDirections() const
{
    Q_D(const QGridLayout);
    return d->expandingDirections(horizontalSpacing(), verticalSpacing());
}